

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRN.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeLRN(ConvertLayerParameters layerParameters)

{
  int iVar1;
  Rep *pRVar2;
  string *psVar3;
  float fVar4;
  Type *pTVar5;
  NeuralNetworkLayer *this;
  LRNLayerParams *pLVar6;
  void **ppvVar7;
  LRNParameter *pLVar8;
  long lVar9;
  long lVar10;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                      *layerParameters.layerId);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (layerParameters.nnWrite);
  if (((pTVar5->bottom_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
     ((pTVar5->top_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    lVar10 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_d8,"Must have 1 input and 1 output",(allocator *)&local_b8);
    errorInCaffeProto(&local_d8,(pTVar5->name_).ptr_,(pTVar5->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_d8);
    lVar10 = (long)(pTVar5->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar5->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  for (lVar9 = 0; lVar10 * 8 != lVar9; lVar9 = lVar9 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&bottom,*(value_type **)((long)ppvVar7 + lVar9));
  }
  pRVar2 = (pTVar5->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  iVar1 = (pTVar5->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar10 = 0; (long)iVar1 * 8 != lVar10; lVar10 = lVar10 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&top,*(value_type **)((long)ppvVar7 + lVar10));
  }
  convertCaffeMetadata
            ((pTVar5->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  pLVar8 = pTVar5->lrn_param_;
  if (pLVar8 == (LRNParameter *)0x0) {
    pLVar8 = (LRNParameter *)&caffe::_LRNParameter_default_instance_;
  }
  if (pLVar8->norm_region_ == 1) {
    std::__cxx11::string::string((string *)&local_d8,"norm_region",&local_da);
    psVar3 = (pTVar5->name_).ptr_;
    std::__cxx11::string::string((string *)&local_b8,"LRN",&local_db);
    std::__cxx11::string::string((string *)&local_68,"WITHIN CHANNEL",&local_d9);
    unsupportedCaffeParrameterWithOption(&local_d8,psVar3,&local_b8,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if (pLVar8->k_ <= 0.0) {
    std::__cxx11::string::string((string *)&local_d8,"k",&local_da);
    psVar3 = (pTVar5->name_).ptr_;
    std::__cxx11::string::string((string *)&local_b8,"LRN",&local_db);
    std::__cxx11::to_string(&local_68,pLVar8->k_);
    unsupportedCaffeParrameterWithOption(&local_d8,psVar3,&local_b8,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  pLVar6 = CoreML::Specification::NeuralNetworkLayer::mutable_lrn(this);
  fVar4 = pLVar8->beta_;
  pLVar6->alpha_ = pLVar8->alpha_;
  pLVar6->beta_ = fVar4;
  pLVar6->localsize_ = (ulong)pLVar8->local_size_;
  pLVar6->k_ = pLVar8->k_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&top);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bottom);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeLRN(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::LRNParameter& caffeLayerParams = caffeLayer.lrn_param();
    
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.norm_region()==caffe::LRNParameter::WITHIN_CHANNEL){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("norm_region",caffeLayer.name(),"LRN","WITHIN CHANNEL");
    }
    if (caffeLayerParams.k() <= 0){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("k",caffeLayer.name(),"LRN",std::to_string(caffeLayerParams.k()));
    }
    //***************************************************************
    
    Specification::LRNLayerParams* specLayerParams = specLayer->mutable_lrn();
    specLayerParams->set_alpha(caffeLayerParams.alpha());
    specLayerParams->set_beta(caffeLayerParams.beta());
    specLayerParams->set_localsize(caffeLayerParams.local_size());
    specLayerParams->set_k(caffeLayerParams.k());
    
}